

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_setting_fx_swap_stream_with_broken_date_as_default_Test::
SubjectFactoryTest_test_setting_fx_swap_stream_with_broken_date_as_default_Test
          (SubjectFactoryTest_test_setting_fx_swap_stream_with_broken_date_as_default_Test *this)

{
  SubjectFactoryTest_test_setting_fx_swap_stream_with_broken_date_as_default_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__SubjectFactoryTest_test_setting_fx_swap_stream_with_broken_date_as_default_Test_003d4090
  ;
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_setting_fx_swap_stream_with_broken_date_as_default)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    ASSERT_STREQ(
            "AssetClass=Fx,BuySideAccount=FX_ACCT,Currency=EUR,DealType=Swap,FarCurrency=EUR,FarQuantity=3500000.00,FarSettlementDate=20181018,FarTenor=BD,Level=1,LiquidityProvider=CSFX,Quantity=3500000.00,RequestFor=Stream,SettlementDate=20180918,Symbol=EURGBP,Tenor=BD,User=fbennett",
            subject_factory.Fx().Stream().Swap()
                    .LiquidityProvider("CSFX")
                    .CurrencyPair("EURGBP")
                    .Currency("EUR")
                    .NearQuantity(3500000)
                    .NearSettlementDate(new Date(2018, 9, 18))
                    .FarQuantity(3500000)
                    .FarSettlementDate(new Date(2018, 10, 18))
                    .CreateSubject()
                    .ToString().c_str());
}